

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intCheck.c
# Opt level: O3

void Inter_CheckStop(Inter_Check_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  if (p != (Inter_Check_t *)0x0) {
    pVVar1 = p->vOrLits;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    pVVar1 = p->vAndLits;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    pVVar1 = p->vAssLits;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    Cnf_DataFree(p->pCnf);
    Aig_ManStop(p->pFrames);
    sat_solver_delete(p->pSat);
    free(p);
    return;
  }
  return;
}

Assistant:

void Inter_CheckStop( Inter_Check_t * p )
{
    if ( p == NULL )
        return;
    Vec_IntFree( p->vOrLits );
    Vec_IntFree( p->vAndLits );
    Vec_IntFree( p->vAssLits );
    Cnf_DataFree( p->pCnf );
    Aig_ManStop( p->pFrames );
    sat_solver_delete( p->pSat );
    ABC_FREE( p );
}